

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Dfa::min_Dfa(Dfa *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *this_01;
  Fa_Node **ppFVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  _Rb_tree_color _Var4;
  ulong *puVar5;
  pointer ppFVar6;
  pointer pEVar7;
  byte bVar8;
  pointer psVar9;
  pointer piVar10;
  bool bVar11;
  uint uVar12;
  ulong *puVar13;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_02;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  Fa_Node *pFVar16;
  int i;
  uint uVar17;
  uint uVar18;
  pointer pEVar19;
  ulong uVar20;
  vector<bool,_std::allocator<bool>_> *__range1;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int k;
  long lVar26;
  int i_2;
  pointer ppFVar27;
  bool bVar28;
  reference rVar29;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  new_node_set;
  int j;
  undefined4 uStack_144;
  Fa_Node *pFStack_140;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> new_Node;
  vector<int,_std::allocator<int>_> belong;
  set<Edge,_std::less<Edge>,_std::allocator<Edge>_> edge_tp;
  map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  mp;
  Node_num_edge to_tp;
  set<int,_std::less<int>,_std::allocator<int>_> node_tp;
  
  this_00 = &this->used;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,(long)this->n + 1,false);
  puVar13 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p;
  puVar5 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  uVar17 = 0;
  while ((puVar13 != puVar5 || (uVar17 != uVar3))) {
    bVar8 = (byte)uVar17 & 0x3f;
    *puVar13 = *puVar13 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
    bVar28 = uVar17 == 0x3f;
    uVar17 = uVar17 + 1;
    puVar13 = puVar13 + bVar28;
    if (bVar28) {
      uVar17 = 0;
    }
  }
  this_01 = &this->Node;
  bVar28 = (bool)((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[1]->temp ^ 1);
  ppFVar6 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar27 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppFVar27 != ppFVar6; ppFVar27 = ppFVar27 + 1) {
    pFVar16 = *ppFVar27;
    rVar29 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)pFVar16->n);
    if ((*rVar29._M_p & rVar29._M_mask) == 0) {
      dfs_del_unreachable_node(this,pFVar16->n,bVar28);
    }
  }
  iVar24 = 0;
  iVar21 = -1;
  do {
    iVar23 = iVar24;
    if (iVar21 == iVar23) {
      std::vector<int,_std::allocator<int>_>::vector
                (&belong,(long)this->n + 1,(allocator_type *)&mp);
      ppFVar27 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      for (lVar26 = 1; lVar26 <= this->n; lVar26 = lVar26 + 1) {
        pFVar16 = ppFVar27[lVar26];
        if (pFVar16->temp == bVar28) {
          if (pFVar16->end == true) {
            belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar26] = 2;
          }
          else {
            belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar26] = 1;
          }
        }
        else {
          belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar26] = 0;
        }
      }
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::vector(&new_node_set,3,(allocator_type *)&mp);
      new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mp._M_t._M_impl._0_8_ = 0;
      std::vector<Fa_Node*,std::allocator<Fa_Node*>>::emplace_back<Fa_Node*>
                ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)&new_Node,(Fa_Node **)&mp);
      mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mp._M_t._M_impl.super__Rb_tree_header._M_header;
      mp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      to_tp.n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &to_tp.n._M_t._M_impl.super__Rb_tree_header._M_header;
      to_tp.n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      to_tp.n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      to_tp.n._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      node_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &node_tp._M_t._M_impl.super__Rb_tree_header._M_header;
      node_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      node_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      node_tp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      to_tp.n._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           to_tp.n._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      node_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           node_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lVar26 = 1; lVar26 <= this->n; lVar26 = lVar26 + 1) {
        pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar26];
        if (pFVar16->temp == bVar28) {
          lVar22 = 0x60;
          if (pFVar16->end == false) {
            lVar22 = 0x30;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     (&((new_node_set.
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                     lVar22),&pFVar16->n);
        }
      }
      uVar3 = 2;
      uVar17 = 0;
      while (uVar12 = uVar3, uVar17 != uVar12) {
        uVar17 = 0;
        if (0 < (int)uVar12) {
          uVar17 = uVar12;
        }
        uVar3 = uVar12;
        for (uVar25 = 1;
            psVar9 = new_node_set.
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar25 != uVar17 + 1;
            uVar25 = uVar25 + 1) {
          std::
          _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::clear(&mp._M_t);
          psVar9 = new_node_set.
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar25;
          for (p_Var14 = new_node_set.
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != &(psVar9->_M_t)._M_impl.super__Rb_tree_header;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            j = p_Var14[1]._M_color;
            std::
            _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
            ::clear((_Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
                     *)&to_tp);
            pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[j];
            pEVar7 = *(pointer *)
                      ((long)&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                              _M_impl + 8);
            for (pEVar19 = (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                           super__Vector_impl_data._M_start; pEVar19 != pEVar7;
                pEVar19 = pEVar19 + 1) {
              if (pEVar19->v->temp == bVar28) {
                edge_tp._M_t._M_impl._0_1_ = pEVar19->c;
                edge_tp._M_t._M_impl._4_4_ =
                     belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[pEVar19->v->n];
                std::
                _Rb_tree<std::pair<char,int>,std::pair<char,int>,std::_Identity<std::pair<char,int>>,std::less<std::pair<char,int>>,std::allocator<std::pair<char,int>>>
                ::_M_insert_unique<std::pair<char,int>const&>
                          ((_Rb_tree<std::pair<char,int>,std::pair<char,int>,std::_Identity<std::pair<char,int>>,std::less<std::pair<char,int>>,std::allocator<std::pair<char,int>>>
                            *)&to_tp,(pair<char,_int> *)&edge_tp);
              }
            }
            this_02 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](&mp,(key_type *)&to_tp);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(this_02,&j);
          }
          bVar11 = true;
          p_Var15 = mp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while ((_Rb_tree_header *)p_Var15 != &mp._M_t._M_impl.super__Rb_tree_header) {
            if (bVar11) {
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              clear(&new_node_set.
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_t);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              operator=(&new_node_set.
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_t,
                        (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)&p_Var15[2]._M_left);
            }
            else {
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::push_back(&new_node_set,(value_type *)&p_Var15[2]._M_left);
              uVar3 = uVar3 + 1;
            }
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
            bVar11 = false;
          }
        }
        uVar18 = 0;
        if (0 < (int)uVar3) {
          uVar18 = uVar3;
        }
        for (uVar25 = 1;
            piVar10 = belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar17 = uVar12, uVar25 != uVar18 + 1;
            uVar25 = uVar25 + 1) {
          for (p_Var14 = psVar9[uVar25]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != &psVar9[uVar25]._M_t._M_impl.super__Rb_tree_header;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            piVar10[(int)p_Var14[1]._M_color] = (int)uVar25;
          }
        }
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize(&new_Node,(long)(int)(uVar12 + 1));
      uVar25 = 0;
      if (0 < (int)uVar12) {
        uVar25 = (ulong)uVar12;
      }
      for (lVar26 = 1; lVar26 - uVar25 != 1; lVar26 = lVar26 + 1) {
        pFVar16 = (Fa_Node *)operator_new(0x28);
        (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar16->n = (int)lVar26;
        pFVar16->start = false;
        pFVar16->end = false;
        pFVar16->temp = false;
        new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar26] = pFVar16;
      }
      ppFVar27 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar27) {
        (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar27;
      }
      ppFVar27 = (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar27) {
        (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar27;
      }
      for (uVar20 = 1; uVar20 != (int)uVar25 + 1; uVar20 = uVar20 + 1) {
        psVar9 = new_node_set.
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar20;
        for (p_Var14 = new_node_set.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var14 != &(psVar9->_M_t)._M_impl.super__Rb_tree_header;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          _Var4 = p_Var14[1]._M_color;
          iVar24 = belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)_Var4];
          pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)_Var4];
          if (pFVar16->start == true) {
            new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start[iVar24]->start = true;
            std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back
                      (&this->begin,
                       new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar24);
            pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[(int)_Var4];
          }
          if (pFVar16->end == true) {
            new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start[iVar24]->end = true;
            std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back
                      (&this->end,
                       new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar24);
            pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[(int)_Var4];
          }
          pEVar7 = *(pointer *)
                    ((long)&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
                    + 8);
          for (pEVar19 = (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_start; pEVar19 != pEVar7; pEVar19 = pEVar19 + 1)
          {
            edge_tp._M_t._M_impl._0_1_ = pEVar19->c;
            edge_tp._M_t._M_impl._1_7_ = *(undefined7 *)&pEVar19->field_0x1;
            edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pEVar19->v;
            if (((Fa_Node *)edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_)->temp ==
                bVar28) {
              std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                        ((vector<Edge,std::allocator<Edge>> *)
                         &new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl
                          .super__Vector_impl_data._M_start[iVar24]->edge,
                         new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start +
                         belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [((Fa_Node *)edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_)->n
                         ],(char *)&edge_tp);
            }
          }
        }
      }
      for (lVar26 = 1;
          ppFVar27 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start, lVar26 <= this->n; lVar26 = lVar26 + 1) {
        pFVar16 = ppFVar27[lVar26];
        if (pFVar16 != (Fa_Node *)0x0) {
          std::_Vector_base<Edge,_std::allocator<Edge>_>::~_Vector_base
                    (&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>);
        }
        operator_delete(pFVar16,0x28);
      }
      if ((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar27) {
        (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar27;
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator=(this_01,&new_Node);
      this->n = uVar12;
      p_Var2 = &edge_tp._M_t._M_impl.super__Rb_tree_header;
      edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edge_tp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar26 = 1;
      edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      for (; lVar26 <= (int)uVar12; lVar26 = lVar26 + 1) {
        std::_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>::
        clear((_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_> *)
              &edge_tp);
        pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar26];
        pEVar7 = *(pointer *)
                  ((long)&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                  8);
        for (pEVar19 = (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                       super__Vector_impl_data._M_start; pEVar19 != pEVar7; pEVar19 = pEVar19 + 1) {
          j._0_1_ = pEVar19->c;
          unique0x10000566 = *(undefined7 *)&pEVar19->field_0x1;
          pFStack_140 = pEVar19->v;
          std::_Rb_tree<Edge,Edge,std::_Identity<Edge>,std::less<Edge>,std::allocator<Edge>>::
          _M_insert_unique<Edge_const&>
                    ((_Rb_tree<Edge,Edge,std::_Identity<Edge>,std::less<Edge>,std::allocator<Edge>>
                      *)&edge_tp,(value_type *)&j);
        }
        pFVar16 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar26];
        pEVar19 = (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                  super__Vector_impl_data._M_start;
        p_Var14 = edge_tp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (*(pointer *)
             ((long)&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8) !=
            pEVar19) {
          *(pointer *)
           ((long)&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8) =
               pEVar19;
        }
        for (; (_Rb_tree_header *)p_Var14 != p_Var2;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          _j = *(undefined8 *)(p_Var14 + 1);
          pFStack_140 = (Fa_Node *)p_Var14[1]._M_parent;
          std::vector<Edge,_std::allocator<Edge>_>::push_back
                    (&(this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar26]->edge,(value_type *)&j);
        }
        uVar12 = this->n;
      }
      std::_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>::
      ~_Rb_tree(&edge_tp._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&node_tp._M_t);
      std::
      _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
                   *)&to_tp);
      std::
      _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&mp._M_t);
      std::_Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>::~_Vector_base
                (&new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>);
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector(&new_node_set);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&belong.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    iVar24 = iVar23;
    for (lVar26 = 1; iVar21 = iVar23, lVar26 <= this->n; lVar26 = lVar26 + 1) {
      ppFVar27 = (this_01->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      rVar29 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (this_00,(long)ppFVar27[lVar26]->n);
      if (((*rVar29._M_p & rVar29._M_mask) != 0) &&
         (pFVar16 = ppFVar27[lVar26], pFVar16->temp != bVar28)) {
        if (pFVar16->end == false) {
          pEVar19 = (pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            if (pEVar19 ==
                *(pointer *)
                 ((long)&(pFVar16->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8
                 )) goto LAB_0010482a;
            ppFVar1 = &pEVar19->v;
            pEVar19 = pEVar19 + 1;
          } while ((*ppFVar1)->temp != bVar28);
        }
        pFVar16->temp = bVar28;
        iVar24 = iVar24 + 1;
      }
LAB_0010482a:
    }
  } while( true );
}

Assistant:

void Dfa::min_Dfa() {
    used.resize(n + 1);
    for (auto i:used) {
        i = false;
    }
    //delete useless node
    bool okflag = !Node[1]->temp;
    for (auto i:begin) {//delete unreachable nodes
        if (!used[i->n]) {
            dfs_del_unreachable_node(i->n, okflag);
        }
    }

    int last_tot, tot;
    for (last_tot = -1, tot = 0; last_tot != tot;) {//delete unterminated nodes
        last_tot = tot;
        for (int k = 1; k <= n; k++) {
            auto &i = Node[k];
            if (used[i->n]) {
                if (i->temp == okflag) {
                    continue;
                }
                if (i->end) {
                    i->temp = okflag;
                    tot++;
                    continue;
                }
                for (auto j:i->edge) {
                    if (j.v->temp == okflag) {
                        i->temp = okflag;
                        tot++;
                        break;
                    }
                }
            }
        }
    }

    vector<int> belong(n + 1);
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                belong[i] = 2;
            } else {
                belong[i] = 1;
            }
        } else {
            belong[i] = 0;
        }
    }

    vector<set<int>> new_node_set(3);
    vector<Fa_Node *> new_Node;

    new_Node.push_back(NULL);

    map<Node_num_edge, set<int>> mp;
    Node_num_edge to_tp;
    set<int> node_tp;
    //reach node set -> node set

    tot = 2;
    last_tot = 0;
    //end node set  and not end node set
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                new_node_set[2].insert(Node[i]->n);
            } else {
                new_node_set[1].insert(Node[i]->n);
            }
        }
    }

    while (last_tot != tot) {
        last_tot = tot;
        for (int i = 1; i <= last_tot; i++) {//all node set
            mp.clear();
            //node_tp.clear();
            for (auto j:new_node_set[i]) {//every node
                to_tp.n.clear();
                for (auto k:Node[j]->edge) {//every edge
                    if (k.v->temp == okflag) {
                        pair<char, int> pair_tp(k.c, belong[k.v->n]);
                        //to_tp.n.insert(make_pair<k.c, belong[k.v->n]>);
                        to_tp.n.insert(pair_tp);
                    }
                }
                mp[to_tp].insert(j);
            }
            //update node set
            int tp_cnt = 0;
            for (const auto &j:mp) {
                if (tp_cnt == 0) {
                    new_node_set[i].clear();
                    new_node_set[i] = j.second;
                    tp_cnt++;
                } else {
                    tot++;
                    new_node_set.push_back(j.second);
                }
            }
        }
        //update belong
        for (int i = 1; i <= tot; i++) {
            for (auto j:new_node_set[i]) {
                belong[j] = i;
            }
        }
    }

    //rebuild DFA
    new_Node.resize(tot + 1);
    for (int i = 1; i <= tot; i++) {
        new_Node[i] = new Fa_Node(i);
    }

    begin.clear();
    end.clear();

    for (int q = 1; q <= tot; q++) {
        for (auto j:new_node_set[q]) {
            int i = belong[j];
            if (Node[j]->start) {
                new_Node[i]->start = true;
                begin.push_back(new_Node[i]);
            }
            if (Node[j]->end) {
                new_Node[i]->end = true;
                end.push_back(new_Node[i]);
            }
            for (auto k:Node[j]->edge) {
                if (k.v->temp == okflag) {
                    new_Node[i]->edge.emplace_back(new_Node[belong[k.v->n]], k.c);
                }
            }
        }
    }

    //delete DFA

    for (int i = 1; i <= n; i++) {
        delete Node[i];
    }

    //update DFA
    Node.clear();
    Node = new_Node;
    n = tot;

    set<Edge> edge_tp;
    //unique edges
    for (int i = 1; i <= n; i++) {
//        if (belong[i] != i) {
//            delete Node[i];
//            continue;
//        }
        edge_tp.clear();
        for (auto j:Node[i]->edge) {
            edge_tp.insert(j);
        }
        Node[i]->edge.clear();
        for (auto j:edge_tp) {
            Node[i]->edge.push_back(j);
        }
    }
}